

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::printCounts(ConsoleReporter *this,string *label,Counts *counts)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (counts->failed + counts->passed == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"1 ",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(label->_M_dataplus)._M_p,label->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," - ",3);
    poVar1 = (this->super_StreamingReporterBase).stream;
    if (counts->failed == 0) {
      pcVar3 = "- both passed";
    }
    else {
      pcVar3 = "- both failed";
    }
    pcVar3 = pcVar3 + 7;
    lVar2 = 6;
    goto LAB_00150038;
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(label->_M_dataplus)._M_p,label->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"s ",2);
  if (counts->passed == 0) {
    poVar1 = (this->super_StreamingReporterBase).stream;
    if (counts->failed != 2) {
      pcVar3 = "- all failed";
LAB_00150033:
      lVar2 = 0xc;
      goto LAB_00150038;
    }
    pcVar3 = "- both failed";
  }
  else {
    if (counts->failed != 0) {
      poVar1 = (this->super_StreamingReporterBase).stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"- ",2);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar3 = " failed";
      lVar2 = 7;
      goto LAB_00150038;
    }
    poVar1 = (this->super_StreamingReporterBase).stream;
    if (counts->passed != 2) {
      pcVar3 = "- all passed";
      goto LAB_00150033;
    }
    pcVar3 = "- both passed";
  }
  lVar2 = 0xd;
LAB_00150038:
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  return;
}

Assistant:

void printCounts( std::string const& label, Counts const& counts ) {
            if( counts.total() == 1 ) {
                stream << "1 " << label << " - ";
                if( counts.failed )
                    stream << "failed";
                else
                    stream << "passed";
            }
            else {
                stream << counts.total() << " " << label << "s ";
                if( counts.passed ) {
                    if( counts.failed )
                        stream << "- " << counts.failed << " failed";
                    else if( counts.passed == 2 )
                        stream << "- both passed";
                    else
                        stream << "- all passed";
                }
                else {
                    if( counts.failed == 2 )
                        stream << "- both failed";
                    else
                        stream << "- all failed";
                }
            }
        }